

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void aom_process_hadamard_lp_8x16
               (MACROBLOCK *x,int max_blocks_high,int max_blocks_wide,int num_4x4_w,int step,
               int block_step)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int16_t *low_coeff;
  int16_t *src_diff;
  int c;
  int r;
  int block;
  int num_4x4;
  int bw;
  macroblock_plane *p;
  int local_54;
  int local_3c;
  int local_38;
  int local_34;
  
  local_54 = in_EDX;
  if (in_ECX < in_EDX) {
    local_54 = in_ECX;
  }
  local_34 = 0;
  for (local_38 = 0; local_38 < in_ESI; local_38 = in_R9D + local_38) {
    for (local_3c = 0; local_3c < local_54; local_3c = in_R9D * 2 + local_3c) {
      (*aom_hadamard_lp_8x8_dual)
                ((int16_t *)(*in_RDI + (long)((local_38 * in_ECX * 4 + local_3c) * 4) * 2),
                 (long)(in_ECX * 4),(int16_t *)(in_RDI[3] + (long)(local_34 << 4) * 2));
      local_34 = in_R8D * 2 + local_34;
    }
  }
  return;
}

Assistant:

static inline void aom_process_hadamard_lp_8x16(MACROBLOCK *x,
                                                int max_blocks_high,
                                                int max_blocks_wide,
                                                int num_4x4_w, int step,
                                                int block_step) {
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  const int bw = 4 * num_4x4_w;
  const int num_4x4 = AOMMIN(num_4x4_w, max_blocks_wide);
  int block = 0;

  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0; c < num_4x4; c += 2 * block_step) {
      const int16_t *src_diff = &p->src_diff[(r * bw + c) << 2];
      int16_t *low_coeff = (int16_t *)p->coeff + BLOCK_OFFSET(block);
      aom_hadamard_lp_8x8_dual(src_diff, (ptrdiff_t)bw, low_coeff);
      block += 2 * step;
    }
  }
}